

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.cpp
# Opt level: O2

void __thiscall
OpenMD::StuntDouble::combineForcesAndTorques
          (StuntDouble *this,Snapshot *snapA,Snapshot *snapB,RealType multA,RealType multB)

{
  DataStoragePointer DVar1;
  uint uVar2;
  long lVar3;
  Vector3d forceB;
  Vector3d forceA;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  uVar2 = DataStorage::getStorageLayout
                    ((DataStorage *)
                     ((long)&(this->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + this->storage_));
  if ((uVar2 & 4) != 0) {
    Vector<double,_3U>::Vector
              (&local_48,
               (Vector<double,_3U> *)
               ((long)this->localIndex_ * 0x18 +
               *(long *)((long)&(snapA->atomData).force.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + this->storage_)));
    Vector<double,_3U>::Vector
              (&local_60,
               (Vector<double,_3U> *)
               ((long)this->localIndex_ * 0x18 +
               *(long *)((long)&(snapB->atomData).force.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + this->storage_)));
    operator*(&local_90,multA,&local_48);
    operator*(&local_a8,multB,&local_60);
    operator+(&local_78,&local_90,&local_a8);
    Vector3<double>::operator=
              ((Vector3<double> *)
               ((long)this->localIndex_ * 0x18 +
               *(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).force.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + this->storage_)),
               &local_78);
  }
  if ((uVar2 & 0x20) != 0) {
    Vector<double,_3U>::Vector
              (&local_48,
               (Vector<double,_3U> *)
               ((long)this->localIndex_ * 0x18 +
               *(long *)((long)&(snapA->atomData).torque.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + this->storage_)));
    Vector<double,_3U>::Vector
              (&local_60,
               (Vector<double,_3U> *)
               ((long)this->localIndex_ * 0x18 +
               *(long *)((long)&(snapB->atomData).torque.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + this->storage_)));
    operator*(&local_90,multA,&local_48);
    operator*(&local_a8,multB,&local_60);
    operator+(&local_78,&local_90,&local_a8);
    Vector3<double>::operator=
              ((Vector3<double> *)
               ((long)this->localIndex_ * 0x18 +
               *(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).torque.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + this->storage_)),
               &local_78);
  }
  if ((uVar2 & 0x40) != 0) {
    lVar3 = (long)this->localIndex_;
    DVar1 = this->storage_;
    *(double *)
     (*(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).particlePot.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + DVar1) + lVar3 * 8) =
         *(double *)
          (*(long *)((long)&(snapA->atomData).particlePot.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + DVar1) + lVar3 * 8) * multA +
         *(double *)
          (*(long *)((long)&(snapB->atomData).particlePot.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + DVar1) + lVar3 * 8) * multB;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    lVar3 = (long)this->localIndex_;
    DVar1 = this->storage_;
    *(double *)
     (*(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).flucQFrc.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + DVar1) + lVar3 * 8) =
         *(double *)
          (*(long *)((long)&(snapA->atomData).flucQFrc.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + DVar1) + lVar3 * 8) * multA +
         *(double *)
          (*(long *)((long)&(snapB->atomData).flucQFrc.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + DVar1) + lVar3 * 8) * multB;
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    Vector<double,_3U>::Vector
              (&local_48,
               (Vector<double,_3U> *)
               ((long)this->localIndex_ * 0x18 +
               *(long *)((long)&(snapA->atomData).electricField.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + this->storage_)));
    Vector<double,_3U>::Vector
              (&local_60,
               (Vector<double,_3U> *)
               ((long)this->localIndex_ * 0x18 +
               *(long *)((long)&(snapB->atomData).electricField.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + this->storage_)));
    operator*(&local_90,multA,&local_48);
    operator*(&local_a8,multB,&local_60);
    operator+(&local_78,&local_90,&local_a8);
    Vector3<double>::operator=
              ((Vector3<double> *)
               ((long)this->localIndex_ * 0x18 +
               *(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).electricField.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + this->storage_)),
               &local_78);
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    lVar3 = (long)this->localIndex_;
    DVar1 = this->storage_;
    *(double *)
     (*(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).sitePotential.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + DVar1) + lVar3 * 8) =
         multA * *(double *)
                  (*(long *)((long)&(snapA->atomData).sitePotential.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + DVar1) + lVar3 * 8) +
         multB * *(double *)
                  (*(long *)((long)&(snapB->atomData).sitePotential.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + DVar1) + lVar3 * 8);
  }
  return;
}

Assistant:

void StuntDouble::combineForcesAndTorques(Snapshot* snapA, Snapshot* snapB,
                                            RealType multA, RealType multB) {
    int sl = (snapshotMan_->getCurrentSnapshot()->*storage_).getStorageLayout();

    assert(sl == (snapA->*storage_).getStorageLayout());
    assert(sl == (snapB->*storage_).getStorageLayout());

    if (sl & DataStorage::dslForce) {
      Vector3d forceA = (snapA->*storage_).force[localIndex_];
      Vector3d forceB = (snapB->*storage_).force[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_).force[localIndex_] =
          multA * forceA + multB * forceB;
    }

    if (sl & DataStorage::dslTorque) {
      Vector3d torqueA = (snapA->*storage_).torque[localIndex_];
      Vector3d torqueB = (snapB->*storage_).torque[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_).torque[localIndex_] =
          multA * torqueA + multB * torqueB;
    }

    if (sl & DataStorage::dslParticlePot) {
      RealType particlePotA = (snapA->*storage_).particlePot[localIndex_];
      RealType particlePotB = (snapB->*storage_).particlePot[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .particlePot[localIndex_] =
          multA * particlePotA + multB * particlePotB;
    }

    if (sl & DataStorage::dslFlucQForce) {
      RealType flucQFrcA = (snapA->*storage_).flucQFrc[localIndex_];
      RealType flucQFrcB = (snapB->*storage_).flucQFrc[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_).flucQFrc[localIndex_] =
          multA * flucQFrcA + multB * flucQFrcB;
    }

    if (sl & DataStorage::dslElectricField) {
      Vector3d electricFieldA = (snapA->*storage_).electricField[localIndex_];
      Vector3d electricFieldB = (snapB->*storage_).electricField[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .electricField[localIndex_] =
          multA * electricFieldA + multB * electricFieldB;
    }

    if (sl & DataStorage::dslSitePotential) {
      RealType sitePotentialA = (snapA->*storage_).sitePotential[localIndex_];
      RealType sitePotentialB = (snapB->*storage_).sitePotential[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .sitePotential[localIndex_] =
          multA * sitePotentialA + multB * sitePotentialB;
    }
  }